

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall
MapLoader::splitLine
          (MapLoader *this,string *line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pLineWords)

{
  bool bVar1;
  istream *piVar2;
  undefined1 local_1c0 [8];
  string s;
  istringstream iss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pLineWords_local;
  string *line_local;
  MapLoader *this_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(s.field_2._M_local_buf + 8),(string *)line,_S_in);
  std::__cxx11::string::string((string *)local_1c0);
  while( true ) {
    piVar2 = std::operator>>((istream *)(s.field_2._M_local_buf + 8),(string *)local_1c0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pLineWords,(value_type *)local_1c0);
  }
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::istringstream::~istringstream((istringstream *)(s.field_2._M_local_buf + 8));
  return;
}

Assistant:

void MapLoader::splitLine(const std::string& line, std::vector<std::string>* pLineWords) {
    //split each line into vector of words (split by spaces)
    std::istringstream iss(line);
    for (std::string s; iss >> s;) {
        pLineWords->push_back(s);
    }
}